

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int read_times(FILE *statfile_fp,uint numcpus,uv_cpu_info_t *ci)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  uint local_49c;
  int r;
  uint n;
  char buf [1024];
  long local_90;
  uint64_t len;
  uint64_t num;
  uint64_t irq;
  uint64_t dummy;
  uint64_t idle;
  uint64_t sys;
  uint64_t nice;
  uint64_t user;
  uint multiplier;
  uint ticks;
  uv_cpu_times_s ts;
  uv_cpu_info_t *ci_local;
  uint numcpus_local;
  FILE *statfile_fp_local;
  
  ts.irq = (uint64_t)ci;
  lVar2 = sysconf(2);
  user._4_4_ = (uint)lVar2;
  if (user._4_4_ == 0xffffffff) {
    __assert_fail("ticks != (unsigned int) -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                  ,0x21b,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
  }
  if (user._4_4_ != 0) {
    user._0_4_ = SUB164((ZEXT816(0) << 0x40 | ZEXT816(1000)) / ZEXT416(user._4_4_),0);
    rewind((FILE *)statfile_fp);
    pcVar3 = fgets((char *)&r,0x400,(FILE *)statfile_fp);
    if (pcVar3 == (char *)0x0) {
      abort();
    }
    len = 0;
    while( true ) {
      pcVar3 = fgets((char *)&r,0x400,(FILE *)statfile_fp);
      if (((pcVar3 == (char *)0x0) || (numcpus <= len)) ||
         (iVar1 = strncmp((char *)&r,"cpu",3), iVar1 != 0)) {
        if (len != numcpus) {
          __assert_fail("num == numcpus",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x24e,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        return 0;
      }
      iVar1 = __isoc99_sscanf(&r,"cpu%u ",&local_49c);
      if (iVar1 != 1) {
        __assert_fail("r == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x231,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
      }
      local_90 = 5;
      while (local_49c = local_49c / 10, local_49c != 0) {
        local_90 = local_90 + 1;
      }
      iVar1 = __isoc99_sscanf((long)&r + local_90,"%lu %lu %lu%lu %lu %lu",&nice,&sys,&idle,&dummy,
                              &irq,&num);
      if (iVar1 != 6) break;
      _multiplier = nice * (uint)user;
      ts.user = sys * (uint)user;
      ts.nice = idle * (uint)user;
      ts.sys = dummy * (uint)user;
      ts.idle = num * (uint)user;
      memcpy((void *)(ts.irq + len * 0x38 + 0x10),&multiplier,0x28);
      len = len + 1;
    }
    abort();
  }
  __assert_fail("ticks != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                ,0x21c,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
}

Assistant:

static int read_times(FILE* statfile_fp,
                      unsigned int numcpus,
                      uv_cpu_info_t* ci) {
  struct uv_cpu_times_s ts;
  unsigned int ticks;
  unsigned int multiplier;
  uint64_t user;
  uint64_t nice;
  uint64_t sys;
  uint64_t idle;
  uint64_t dummy;
  uint64_t irq;
  uint64_t num;
  uint64_t len;
  char buf[1024];

  ticks = (unsigned int)sysconf(_SC_CLK_TCK);
  assert(ticks != (unsigned int) -1);
  assert(ticks != 0);
  multiplier = ((uint64_t)1000L / ticks);

  rewind(statfile_fp);

  if (!fgets(buf, sizeof(buf), statfile_fp))
    abort();

  num = 0;

  while (fgets(buf, sizeof(buf), statfile_fp)) {
    if (num >= numcpus)
      break;

    if (strncmp(buf, "cpu", 3))
      break;

    /* skip "cpu<num> " marker */
    {
      unsigned int n;
      int r = sscanf(buf, "cpu%u ", &n);
      assert(r == 1);
      (void) r;  /* silence build warning */
      for (len = sizeof("cpu0"); n /= 10; len++);
    }

    /* Line contains user, nice, system, idle, iowait, irq, softirq, steal,
     * guest, guest_nice but we're only interested in the first four + irq.
     *
     * Don't use %*s to skip fields or %ll to read straight into the uint64_t
     * fields, they're not allowed in C89 mode.
     */
    if (6 != sscanf(buf + len,
                    "%" PRIu64 " %" PRIu64 " %" PRIu64
                    "%" PRIu64 " %" PRIu64 " %" PRIu64,
                    &user,
                    &nice,
                    &sys,
                    &idle,
                    &dummy,
                    &irq))
      abort();

    ts.user = user * multiplier;
    ts.nice = nice * multiplier;
    ts.sys  = sys * multiplier;
    ts.idle = idle * multiplier;
    ts.irq  = irq * multiplier;
    ci[num++].cpu_times = ts;
  }
  assert(num == numcpus);

  return 0;
}